

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O0

TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> * __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::operator=
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *this,
          TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *cp)

{
  long in_RSI;
  TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *in_RDI;
  TPZGeoBlend<pzgeom::TPZGeoQuad> *unaff_retaddr;
  TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *copy;
  
  copy = in_RDI;
  TPZGeoBlend<pzgeom::TPZGeoQuad>::operator=
            (unaff_retaddr,&in_RDI->super_TPZGeoBlend<pzgeom::TPZGeoQuad>);
  in_RDI->fR = *(REAL *)(in_RSI + 0xa80);
  TPZVec<double>::operator=((TPZVec<double> *)unaff_retaddr,(TPZVec<double> *)copy);
  return in_RDI;
}

Assistant:

TPZQuadSphere &operator=(const TPZQuadSphere &cp)
        {
            GeomQuad::operator=(cp);
            fR = cp.fR;
            fxc = cp.fxc;
            return *this;
        }